

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  PFNGLDRAWELEMENTSPROC p_Var2;
  PFNGLUNIFORM1FPROC p_Var3;
  PFNGLUNIFORM1IPROC p_Var4;
  PFNGLUNIFORMMATRIX4FVPROC p_Var5;
  GLFWwindow *pGVar6;
  bool bVar7;
  int iVar8;
  GLint GVar9;
  ostream *poVar10;
  _func_void_int_char_ptr *cbfun;
  _func_void_GLFWwindow_ptr_int_int *cbfun_00;
  _func_void_GLFWwindow_ptr_int_int_int_int *cbfun_01;
  _func_void_GLFWwindow_ptr_uint_int *cbfun_02;
  _func_void_GLFWwindow_ptr_int_int_int *cbfun_03;
  _func_void_GLFWwindow_ptr_double_double *p_Var11;
  Scalar *pSVar12;
  PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *this;
  Index IVar13;
  double dVar14;
  string *local_290;
  int local_1dc;
  duration<long,_std::ratio<1L,_1000000L>_> local_1d8;
  undefined8 local_1d0;
  double min_duration;
  double duration;
  double dStack_1b8;
  int i;
  double now;
  string local_1a8 [37];
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_183;
  undefined1 local_182;
  allocator local_181;
  string *local_180;
  string local_178 [32];
  iterator local_158;
  size_type local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  double local_130;
  double tic;
  float start_time;
  anon_class_1_0_00000001 any_changed;
  double time_of_last_json_load;
  double time_of_last_shader_compilation;
  __5 local_108;
  __4 local_107;
  __3 local_106;
  __2 local_105;
  int local_104;
  int local_100;
  int height_window;
  int width_window;
  anon_class_1_0_00000001 *reshape;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  GLFWwindow *local_a0;
  GLFWwindow *window;
  __0 *local_90;
  anon_class_1_0_00000001 *error;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fragment_shader_paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tess_evaluation_shader_paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tess_control_shader_paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vertex_shader_paths;
  char **argv_local;
  int argc_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&tess_control_shader_paths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&tess_evaluation_shader_paths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&fragment_shader_paths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78);
  iVar8 = glfwInit();
  if (iVar8 == 0) {
    poVar10 = std::operator<<((ostream *)&std::cerr,"Could not initialize glfw");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  else {
    local_90 = (__0 *)((long)&window + 7);
    cbfun = main::$_0::operator_cast_to_function_pointer(local_90);
    glfwSetErrorCallback(cbfun);
    glfwWindowHint(0x2100d,4);
    glfwWindowHint(0x22002,4);
    glfwWindowHint(0x22003,0);
    glfwWindowHint(0x22008,0x32001);
    glfwWindowHint(0x22006,1);
    local_a0 = glfwCreateWindow(width,height,"shader-pipeline",(GLFWmonitor *)0x0,(GLFWwindow *)0x0)
    ;
    if (local_a0 == (GLFWwindow *)0x0) {
      glfwTerminate();
      poVar10 = std::operator<<((ostream *)&std::cerr,"Could not create glfw window");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
    }
    else {
      std::operator<<((ostream *)&std::cout,
                      "\nUsage:\n  [Click and drag]  to orbit view\n  [Scroll]  to translate view in and out\n  A,a  toggle animation\n  L,l  toggle wireframe rending\n  Z,z  reset view to look along z-axis\n"
                     );
      glfwSetWindowPos(local_a0,0,0);
      glfwMakeContextCurrent(local_a0);
      iVar8 = gladLoadGLLoader(glfwGetProcAddress);
      if (iVar8 == 0) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Failed to load OpenGL and its extensions");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
      }
      else {
        print_opengl_info(local_a0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c0,"init",&local_c1);
        igl::opengl::report_gl_error((string *)local_c0);
        std::__cxx11::string::~string(local_c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        icosahedron<Eigen::Matrix<float,_1,3,1,_1,3>,Eigen::Matrix<unsigned_int,_1,3,1,_1,3>>
                  (&V.super_PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_>,
                   &F.super_PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_>);
        mesh_to_vao(&V,&F,&VAO);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e8,"mesh_to_vao",(allocator *)((long)&reshape + 7));
        igl::opengl::report_gl_error((string *)local_e8);
        std::__cxx11::string::~string(local_e8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&reshape + 7));
        pGVar6 = local_a0;
        _width_window = (__1 *)((long)&height_window + 3);
        cbfun_00 = main::$_1::operator_cast_to_function_pointer(_width_window);
        glfwSetWindowSizeCallback(pGVar6,cbfun_00);
        glfwGetWindowSize(local_a0,&local_100,&local_104);
        main::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)_width_window,local_a0,local_100,local_104);
        pGVar6 = local_a0;
        cbfun_01 = main::$_2::operator_cast_to_function_pointer(&local_105);
        glfwSetKeyCallback(pGVar6,cbfun_01);
        pGVar6 = local_a0;
        cbfun_02 = main::$_3::operator_cast_to_function_pointer(&local_106);
        glfwSetCharModsCallback(pGVar6,cbfun_02);
        pGVar6 = local_a0;
        cbfun_03 = main::$_4::operator_cast_to_function_pointer(&local_107);
        glfwSetMouseButtonCallback(pGVar6,cbfun_03);
        pGVar6 = local_a0;
        p_Var11 = main::$_5::operator_cast_to_function_pointer(&local_108);
        glfwSetCursorPosCallback(pGVar6,p_Var11);
        pGVar6 = local_a0;
        p_Var11 = main::$_6::operator_cast_to_function_pointer
                            ((__6 *)((long)&time_of_last_shader_compilation + 7));
        glfwSetScrollCallback(pGVar6,p_Var11);
        (*glad_glEnable)(0xb71);
        (*glad_glEnable)(0xb44);
        time_of_last_json_load = 0.0;
        _start_time = 0.0;
        dVar14 = get_seconds();
        tic._0_4_ = (float)dVar14;
        while (iVar8 = glfwWindowShouldClose(local_a0), iVar8 == 0) {
          local_130 = get_seconds();
          local_182 = 1;
          pcVar1 = argv[1];
          local_180 = local_178;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_178,pcVar1,&local_181);
          local_182 = 0;
          local_158 = (iterator)local_178;
          local_150 = 1;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator(&local_183);
          __l._M_len = local_150;
          __l._M_array = local_158;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_148,__l,&local_183);
          bVar7 = main::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)((long)&tic + 7),&local_148,_start_time);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_148);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator(&local_183);
          local_290 = (string *)&local_158;
          do {
            local_290 = local_290 + -0x20;
            std::__cxx11::string::~string(local_290);
          } while (local_290 != local_178);
          std::allocator<char>::~allocator((allocator<char> *)&local_181);
          if (bVar7) {
            poVar10 = std::operator<<((ostream *)&std::cout,
                                      "-----------------------------------------------");
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            _start_time = get_seconds();
            pcVar1 = argv[1];
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1a8,pcVar1,(allocator *)((long)&now + 7));
            bVar7 = read_json((string *)local_1a8,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&tess_control_shader_paths.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&tess_evaluation_shader_paths.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&fragment_shader_paths.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_78);
            std::__cxx11::string::~string(local_1a8);
            std::allocator<char>::~allocator((allocator<char> *)((long)&now + 7));
            if (((bVar7 ^ 0xffU) & 1) != 0) {
              poVar10 = std::operator<<((ostream *)&std::cerr,"Failed to read ");
              poVar10 = std::operator<<(poVar10,argv[1]);
              std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            }
            time_of_last_json_load = 0.0;
          }
          bVar7 = main::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)((long)&tic + 7),
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&tess_control_shader_paths.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             time_of_last_json_load);
          if ((((bVar7) ||
               (bVar7 = main::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)((long)&tic + 7),
                                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&tess_evaluation_shader_paths.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   time_of_last_json_load), bVar7)) ||
              (bVar7 = main::anon_class_1_0_00000001::operator()
                                 ((anon_class_1_0_00000001 *)((long)&tic + 7),
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&fragment_shader_paths.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  time_of_last_json_load), bVar7)) ||
             (bVar7 = main::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)((long)&tic + 7),
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_78,time_of_last_json_load), bVar7)) {
            poVar10 = std::operator<<((ostream *)&std::cout,
                                      "-----------------------------------------------");
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            time_of_last_json_load = get_seconds();
            bVar7 = create_shader_program_from_files
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&tess_control_shader_paths.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&tess_evaluation_shader_paths.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&fragment_shader_paths.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_78,&prog_id);
            if (!bVar7) {
              (*glad_glDeleteProgram)(prog_id);
              prog_id = 0;
              poVar10 = std::operator<<((ostream *)&std::cout,
                                        "-----------------------------------------------");
              std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            }
          }
          (*glad_glClearColor)(0.0,0.0,0.0,0.0);
          (*glad_glClear)(0x4100);
          glfwGetFramebufferSize(local_a0,&width,&height);
          (*glad_glViewport)(0,0,width,height);
          (*glad_glUseProgram)(prog_id);
          if ((is_animating & 1U) != 0) {
            dStack_1b8 = get_seconds();
            animation_seconds = (dStack_1b8 - last_time) + animation_seconds;
            last_time = dStack_1b8;
          }
          p_Var3 = glad_glUniform1f;
          GVar9 = (*glad_glGetUniformLocation)(prog_id,"animation_seconds");
          (*p_Var3)(GVar9,(float)animation_seconds);
          p_Var5 = glad_glUniformMatrix4fv;
          GVar9 = (*glad_glGetUniformLocation)(prog_id,"proj");
          pSVar12 = Eigen::PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::data
                              (&proj.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>);
          (*p_Var5)(GVar9,1,'\0',pSVar12);
          p_Var5 = glad_glUniformMatrix4fv;
          GVar9 = (*glad_glGetUniformLocation)(prog_id,"view");
          this = &Eigen::Transform<float,_3,_2,_0>::matrix(&view)->
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>;
          pSVar12 = Eigen::PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::data(this);
          (*p_Var5)(GVar9,1,'\0',pSVar12);
          if ((wire_frame & 1U) == 0) {
            (*glad_glPolygonMode)(0x408,0x1b02);
          }
          else {
            (*glad_glPolygonMode)(0x408,0x1b01);
          }
          for (duration._4_4_ = 0; p_Var4 = glad_glUniform1i, duration._4_4_ < 2;
              duration._4_4_ = duration._4_4_ + 1) {
            GVar9 = (*glad_glGetUniformLocation)(prog_id,"is_moon");
            (*p_Var4)(GVar9,(uint)(duration._4_4_ == 1));
            (*glad_glBindVertexArray)(VAO);
            p_Var2 = glad_glDrawElements;
            IVar13 = Eigen::EigenBase<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::size
                               ((EigenBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *)&F);
            (*p_Var2)(0xe,(GLsizei)IVar13,0x1405,(void *)0x0);
            (*glad_glBindVertexArray)(0);
          }
          glfwSwapBuffers(local_a0);
          glfwPollEvents();
          dVar14 = get_seconds();
          min_duration = (dVar14 - local_130) * 1000000.0;
          local_1d0 = 0x40d046aaaaaaaaab;
          if (min_duration < 16666.666666666668) {
            local_1dc = (int)(16666.666666666668 - min_duration);
            std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
                      ((duration<long,std::ratio<1l,1000000l>> *)&local_1d8,&local_1dc);
            std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(&local_1d8);
          }
        }
        glfwDestroyWindow(local_a0);
        glfwTerminate();
        argv_local._4_4_ = 0;
      }
    }
  }
  error._0_4_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&fragment_shader_paths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tess_evaluation_shader_paths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tess_control_shader_paths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char * argv[])
{

  std::vector<std::string> vertex_shader_paths;
  std::vector<std::string> tess_control_shader_paths;
  std::vector<std::string> tess_evaluation_shader_paths;
  std::vector<std::string> fragment_shader_paths;

  // Initialize glfw window
  if(!glfwInit())
  {
    std::cerr<<"Could not initialize glfw"<<std::endl;
     return EXIT_FAILURE;
  }
  const auto & error = [] (int error, const char* description)
  {
    std::cerr<<description<<std::endl;
  };
  glfwSetErrorCallback(error);
  glfwWindowHint(GLFW_SAMPLES, 4);
  glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
  glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);
  glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
  glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
  GLFWwindow* window = glfwCreateWindow(width, height, "shader-pipeline", NULL, NULL);
  if(!window)
  {
    glfwTerminate();
    std::cerr<<"Could not create glfw window"<<std::endl;
    return EXIT_FAILURE;
  }
  std::cout<<R"(
Usage:
  [Click and drag]  to orbit view
  [Scroll]  to translate view in and out
  A,a  toggle animation
  L,l  toggle wireframe rending
  Z,z  reset view to look along z-axis
)";
  glfwSetWindowPos(window,0,0);
  glfwMakeContextCurrent(window);
  // Load OpenGL and its extensions
  if (!gladLoadGLLoader((GLADloadproc) glfwGetProcAddress))
  {
    std::cerr<<"Failed to load OpenGL and its extensions"<<std::endl;
    return EXIT_FAILURE;
  }
  print_opengl_info(window);
  igl::opengl::report_gl_error("init");


  icosahedron(V,F);
  mesh_to_vao(V,F,VAO);
  igl::opengl::report_gl_error("mesh_to_vao");

  const auto & reshape = [](
    GLFWwindow* window,
    int _width,
    int _height)
  {
    ::width=_width,::height=_height;

    // augh, windows can't handle variables named near and far.
    float nearVal = 0.01;
    float farVal = 100;
    float top = tan(35./360.*M_PI)*nearVal;
    float right = top * (double)::width/(double)::height;
    float left = -right;
    float bottom = -top;
    proj.setConstant(4,4,0.);
    proj(0,0) = (2.0 * nearVal) / (right - left);
    proj(1,1) = (2.0 * nearVal) / (top - bottom);
    proj(0,2) = (right + left) / (right - left);
    proj(1,2) = (top + bottom) / (top - bottom);
    proj(2,2) = -(farVal + nearVal) / (farVal - nearVal);
    proj(3,2) = -1.0;
    proj(2,3) = -(2.0 * farVal * nearVal) / (farVal - nearVal);
  };
  // Set up window resizing
  glfwSetWindowSizeCallback(window,reshape);
  {
    int width_window, height_window;
    glfwGetWindowSize(window, &width_window, &height_window);
    reshape(window,width_window,height_window);
  }

  // Close the window if user presses ESC or CTRL+C
  glfwSetKeyCallback(
    window,
    [](GLFWwindow* window, int key, int scancode, int action, int mods)
    {
      if(key == 256 || (key == 67 && (mods & GLFW_MOD_CONTROL)))
      {
        glfwSetWindowShouldClose(window,true);
      }
    });
  glfwSetCharModsCallback(
    window,
    [](GLFWwindow* window, unsigned int codepoint, int modifier)
    {
      switch(codepoint)
      {
        case 'A':
        case 'a':
          is_animating ^= 1;
          if(is_animating)
          {
            last_time = get_seconds();
          }
          break;
        case 'L':
        case 'l':
          wire_frame ^= 1;
          if (wire_frame) {
            glDisable(GL_CULL_FACE);
          } else {
            glEnable(GL_CULL_FACE);
          }
          break;
        case 'Z':
        case 'z':
          view.matrix().block(0,0,3,3).setIdentity();
          break;
        default:
          std::cout<<"Unrecognized key: "<<(unsigned char) codepoint<<std::endl;
          break;
      }
    });
  glfwSetMouseButtonCallback(
    window,
    [](GLFWwindow * window, int button, int action, int mods)
    {
      mouse_down = action == GLFW_PRESS;
    });
  glfwSetCursorPosCallback(
    window,
    [](GLFWwindow * window, double x, double y)
    {
      static double mouse_last_x = x;
      static double mouse_last_y = y;
      double dx = x-mouse_last_x;
      double dy = y-mouse_last_y;
      if(mouse_down)
      {
        // Two axis valuator with fixed up
        float factor = std::abs(view.matrix()(2,3));
        view.rotate(
          Eigen::AngleAxisf(
            dx*factor/float(width),
            Eigen::Vector3f(0,1,0)));
        view.rotate(
          Eigen::AngleAxisf(
            dy*factor/float(height),
            view.matrix().topLeftCorner(3,3).inverse()*Eigen::Vector3f(1,0,0)));
      }
      mouse_last_x = x;
      mouse_last_y = y;
    });
  glfwSetScrollCallback(window,
    [](GLFWwindow * window, double xoffset, double yoffset)
    {
      view.matrix()(2,3) =
        std::min(std::max(view.matrix()(2,3)+(float)yoffset,-100.0f),-2.0f);
    });

  glEnable(GL_DEPTH_TEST);
  glEnable(GL_CULL_FACE);
  // Force compilation on first iteration through loop
  double time_of_last_shader_compilation = 0;
  double time_of_last_json_load = 0;
  const auto any_changed = 
    [](
        const std::vector<std::string> &paths,
        const double time_of_last_shader_compilation
        )->bool
  {
    for(const auto & path : paths)
    {
      if(last_modification_time(path) > time_of_last_shader_compilation)
      {
        std::cout<<path<<" has changed since last compilation attempt."<<std::endl;
        return true;
      }
    }
    return false;
  };

  float start_time = get_seconds();
  // Main display routine
  while (!glfwWindowShouldClose(window))
  {
    double tic = get_seconds();

    if(any_changed({argv[1]},time_of_last_json_load))
    {
      std::cout<<"-----------------------------------------------"<<std::endl;
      time_of_last_json_load = get_seconds();
      if(!read_json(argv[1],
            vertex_shader_paths,
            tess_control_shader_paths,
            tess_evaluation_shader_paths,
            fragment_shader_paths))
      {
        std::cerr<<"Failed to read "<<argv[1]<<std::endl;
      }
#ifdef USE_SOLUTION
      {
        const auto replace_all = [](std::vector<std::string> & paths)
        {
          for(auto & path : paths)
          {
            find_and_replace_all("/src/","/solution/",path);
          }
        };
        replace_all(vertex_shader_paths);
        replace_all(tess_control_shader_paths);
        replace_all(tess_evaluation_shader_paths);
        replace_all(fragment_shader_paths);
      }
#endif
      // force reload of shaders
      time_of_last_shader_compilation = 0;
    }
    if(
      any_changed(vertex_shader_paths         ,time_of_last_shader_compilation) ||
      any_changed(tess_control_shader_paths   ,time_of_last_shader_compilation) ||
      any_changed(tess_evaluation_shader_paths,time_of_last_shader_compilation) ||
      any_changed(fragment_shader_paths       ,time_of_last_shader_compilation))
    {
      std::cout<<"-----------------------------------------------"<<std::endl;
      // remember the time we tried to compile
      time_of_last_shader_compilation = get_seconds();
      if(
          !create_shader_program_from_files(
            vertex_shader_paths,
            tess_control_shader_paths,
            tess_evaluation_shader_paths,
            fragment_shader_paths,
            prog_id))
      {
        // Force null shader to visually indicate failure
        glDeleteProgram(prog_id);
        prog_id = 0;
        std::cout<<"-----------------------------------------------"<<std::endl;
      }
    }

    // clear screen and set viewport
    glClearColor(0,0,0,0);
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
    glfwGetFramebufferSize(window, &::width, &::height);
    glViewport(0,0,::width,::height);
    // select program 
    glUseProgram(prog_id);
    // Attach uniforms
    {
      if(is_animating)
      {
        double now = get_seconds();
        animation_seconds += now - last_time;
        last_time = now;
      }
      glUniform1f(glGetUniformLocation(prog_id,"animation_seconds"),animation_seconds);
    }
    glUniformMatrix4fv(
      glGetUniformLocation(prog_id,"proj"),1,false,proj.data());
    glUniformMatrix4fv(
      glGetUniformLocation(prog_id,"view"),1,false,view.matrix().data());
    // Draw mesh as wireframe
    if(wire_frame)
    {
      glPolygonMode(GL_FRONT_AND_BACK, GL_LINE);
    }else
    {
      glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
    }
    for(int i = 0;i<2;i++)
    {
      glUniform1i(glGetUniformLocation(prog_id, "is_moon"), i==1);
      glBindVertexArray(VAO);
      glDrawElements(GL_PATCHES, F.size(), GL_UNSIGNED_INT, 0);
      glBindVertexArray(0);
    }


    glfwSwapBuffers(window);

    // 60 fps
    {
      glfwPollEvents();
      // In microseconds
      double duration = 1000000.*(get_seconds()-tic);
      const double min_duration = 1000000./60.;
      if(duration<min_duration)
      {
        std::this_thread::sleep_for(std::chrono::microseconds((int)(min_duration-duration)));
      }
    }
  }

  // Graceful exit
  glfwDestroyWindow(window);
  glfwTerminate();
  return EXIT_SUCCESS;
}